

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char *significand,
          int significand_size,int integral_size,char8_t decimal_point)

{
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out_00;
  undefined3 in_register_00000081;
  char8_t local_29;
  
  local_29 = decimal_point;
  out_00 = copy_str_noinline<char8_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                     (significand,significand + integral_size,out);
  if (CONCAT31(in_register_00000081,decimal_point) != 0) {
    buffer<char8_t>::push_back(out_00.container,&local_29);
    out_00 = copy_str_noinline<char8_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                       (significand + integral_size,significand + significand_size,out_00);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out_00.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}